

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeaderValidator_p.cpp
# Opt level: O3

bool __thiscall BamTools::Internal::SamHeaderValidator::ValidateGroupOrder(SamHeaderValidator *this)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __n = (this->m_header->GroupOrder)._M_string_length;
  bVar2 = true;
  if (__n != 0) {
    __rhs = &this->m_header->GroupOrder;
    if ((__n == _DAT_0016fad8) &&
       (iVar1 = bcmp((__rhs->_M_dataplus)._M_p,Constants::SAM_HD_GROUPORDER_NONE_abi_cxx11_,__n),
       iVar1 == 0)) {
      return true;
    }
    if ((__n == DAT_0016faf8) &&
       (iVar1 = bcmp((__rhs->_M_dataplus)._M_p,Constants::SAM_HD_GROUPORDER_QUERY_abi_cxx11_,__n),
       iVar1 == 0)) {
      return true;
    }
    if ((__n == DAT_0016fb18) &&
       (iVar1 = bcmp((__rhs->_M_dataplus)._M_p,Constants::SAM_HD_GROUPORDER_REFERENCE_abi_cxx11_,__n
                    ), iVar1 == 0)) {
      return true;
    }
    std::operator+(&local_40,"Invalid group order (GO): ",__rhs);
    AddError(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SamHeaderValidator::ValidateGroupOrder(void) {

    const string& groupOrder = m_header.GroupOrder;

    // if no group order, no problem, just return OK
    if ( groupOrder.empty() )
        return true;

    // if group order is valid keyword
    if ( groupOrder == Constants::SAM_HD_GROUPORDER_NONE  ||
         groupOrder == Constants::SAM_HD_GROUPORDER_QUERY ||
         groupOrder == Constants::SAM_HD_GROUPORDER_REFERENCE
       )
    {
        return true;
    }

    // otherwise
    AddError("Invalid group order (GO): " + groupOrder);
    return false;
}